

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::IntermediateNode::destroyChildren
          (IntermediateNode *this)

{
  long *plVar1;
  IntermediateNode *pIVar2;
  Node *pNVar3;
  char cVar4;
  int iVar5;
  undefined8 *puVar6;
  IntermediateNode *in;
  NodeIterator children;
  long *local_30;
  
  if (destroyChildren()::toDelete == '\0') {
    destroyChildren();
  }
  destroyChildren::toDelete._cursor = destroyChildren::toDelete._stack;
  if (destroyChildren::toDelete._stack == destroyChildren::toDelete._end) {
    ::Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*>::expand
              (&destroyChildren::toDelete);
  }
  *destroyChildren::toDelete._cursor = &this->super_Node;
  destroyChildren::toDelete._cursor = destroyChildren::toDelete._cursor + 1;
  if (destroyChildren::toDelete._cursor != destroyChildren::toDelete._stack) {
    do {
      pIVar2 = (IntermediateNode *)destroyChildren::toDelete._cursor[-1];
      destroyChildren::toDelete._cursor = destroyChildren::toDelete._cursor + -1;
      iVar5 = (*(pIVar2->super_Node)._vptr_Node[2])(pIVar2);
      if ((char)iVar5 == '\0') {
        (*(pIVar2->super_Node)._vptr_Node[8])(&local_30,pIVar2);
        while( true ) {
          cVar4 = (**(code **)(*local_30 + 0x10))();
          if (cVar4 == '\0') break;
          puVar6 = (undefined8 *)(**(code **)(*local_30 + 0x18))();
          pNVar3 = (Node *)*puVar6;
          if (destroyChildren::toDelete._cursor == destroyChildren::toDelete._end) {
            ::Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*>
            ::expand(&destroyChildren::toDelete);
          }
          *destroyChildren::toDelete._cursor = pNVar3;
          destroyChildren::toDelete._cursor = destroyChildren::toDelete._cursor + 1;
        }
        (*(pIVar2->super_Node)._vptr_Node[0xc])(pIVar2);
        if (local_30 != (long *)0x0) {
          plVar1 = local_30 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*local_30 + 8))();
          }
        }
      }
      if (pIVar2 != this) {
        (*(pIVar2->super_Node)._vptr_Node[1])(pIVar2);
      }
    } while (destroyChildren::toDelete._cursor != destroyChildren::toDelete._stack);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::destroyChildren()
{
  static Stack<Node*> toDelete;
  toDelete.reset();
  toDelete.push(this);
  while(toDelete.isNonEmpty()) {
    Node* n=toDelete.pop();
    if(!n->isLeaf()) {
      IntermediateNode* in=static_cast<IntermediateNode*>(n);
      NodeIterator children=in->allChildren();
      while(children.hasNext()) {
	toDelete.push(*children.next());
      }
      in->removeAllChildren();
    }
    if(n!=this) {
      delete n;
    }
  }
}